

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O0

NameEquality
google::protobuf::compiler::java::anon_unknown_0::CheckNameEquality(string_view a,string_view b)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type _Var1;
  bool bVar2;
  char *pcVar3;
  string_view s;
  string_view s_00;
  string local_88;
  lts_20250127 *local_68;
  char *pcStack_60;
  string local_50;
  lts_20250127 *plStack_30;
  string_view b_local;
  string_view a_local;
  
  pcVar3 = a._M_str;
  local_68 = (lts_20250127 *)a._M_len;
  s._M_str = b._M_str;
  plStack_30 = (lts_20250127 *)b._M_len;
  s._M_len = (size_t)pcVar3;
  pcStack_60 = pcVar3;
  b_local._M_len = (size_t)s._M_str;
  b_local._M_str = (char *)local_68;
  absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_50,local_68,s);
  s_00._M_str = s._M_str;
  s_00._M_len = b_local._M_len;
  absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_88,plStack_30,s_00);
  _Var1 = std::operator==(&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_50);
  if (_Var1) {
    __x._M_str = pcVar3;
    __x._M_len = (size_t)b_local._M_str;
    __y._M_str = (char *)b_local._M_len;
    __y._M_len = (size_t)plStack_30;
    bVar2 = std::operator==(__x,__y);
    if (bVar2) {
      a_local._M_str._4_4_ = EXACT_EQUAL;
    }
    else {
      a_local._M_str._4_4_ = EQUAL_IGNORE_CASE;
    }
  }
  else {
    a_local._M_str._4_4_ = NO_MATCH;
  }
  return a_local._M_str._4_4_;
}

Assistant:

NameEquality CheckNameEquality(absl::string_view a, absl::string_view b) {
  if (absl::AsciiStrToUpper(a) == absl::AsciiStrToUpper(b)) {
    if (a == b) {
      return NameEquality::EXACT_EQUAL;
    }
    return NameEquality::EQUAL_IGNORE_CASE;
  }
  return NameEquality::NO_MATCH;
}